

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.c
# Opt level: O0

int lws_h2_num(int starting_bits,unsigned_long num,uchar **p,uchar *end)

{
  byte *pbVar1;
  uint uVar2;
  uint mask;
  uchar *end_local;
  uchar **p_local;
  unsigned_long num_local;
  int starting_bits_local;
  
  uVar2 = (1 << ((byte)starting_bits & 0x1f)) - 1;
  if (uVar2 <= num) {
    p_local = (uchar **)(num - uVar2);
    do {
      if (p_local < (uchar **)0x80) {
        pbVar1 = *p;
        *p = pbVar1 + 1;
        *pbVar1 = (byte)p_local & 0x7f;
      }
      else {
        pbVar1 = *p;
        *p = pbVar1 + 1;
        *pbVar1 = (byte)p_local & 0x7f | 0x80;
      }
      if (end <= *p) {
        return 1;
      }
      p_local = (uchar **)((ulong)p_local >> 7);
    } while (p_local != (uchar **)0x0);
  }
  return 0;
}

Assistant:

static int
lws_h2_num(int starting_bits, unsigned long num,
			 unsigned char **p, unsigned char *end)
{
	unsigned int mask = (1 << starting_bits) - 1;

	if (num < mask)
		return 0;

	num -= mask;
	do {
		if (num > 127)
			*((*p)++) = 0x80 | (num & 0x7f);
		else
			*((*p)++) = 0x00 | (num & 0x7f);
		if (*p >= end)
			return 1;
		num >>= 7;
	} while (num);

	return 0;
}